

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O2

void func_call_static_var(size_t n)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  size_t res;
  size_t local_38;
  double local_30;
  
  local_38 = 0;
  iVar5 = 0x10000000;
  sVar2 = 0;
  lVar1 = std::chrono::_V2::system_clock::now();
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    sVar2 = f_with_static_variable(&local_38,n);
    sVar2 = sVar2 + local_38;
    local_38 = sVar2;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  side_effect = side_effect + ((uint)sVar2 & 1);
  dVar7 = (double)(lVar3 - lVar1) / 1000000000.0;
  dVar8 = dVar7 * 1000.0 * 1000.0 * 1000.0 * 3.725290298461914e-09;
  local_30 = ((268435456.0 / dVar7) / 1000.0) / 1000.0;
  expand_name("func_call_static_var");
  poVar4 = std::operator<<((ostream *)&std::cout,expand_name::buf);
  std::operator<<(poVar4,": ");
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::operator<<(poVar4,"ns per operation,\t");
  poVar4 = std::ostream::_M_insert<double>(dVar8 / unit);
  std::operator<<(poVar4," ticks,\t");
  poVar4 = std::ostream::_M_insert<double>(local_30);
  poVar4 = std::operator<<(poVar4," Mrps");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_static_var(size_t n)
{
    size_t res = 0;
    now_t start = now();
    const size_t COUNT = 0x10000000;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        size_t x = f_with_static_variable(res, n);
        res += x;
    }
    now_t stop = now();
    side_effect += res % 2;


    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}